

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/string_object.cpp:121:35)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_string_object_cpp:121:35)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  value *v;
  void *pvVar1;
  gc_heap_ptr_untyped gStack_48;
  gc_heap_ptr_untyped local_38;
  string_view local_28;
  
  pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  v = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_start;
  if (v == (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_finish) {
    local_28._M_len = 0;
    local_28._M_str = "";
    string::string((string *)&gStack_48,*(gc_heap **)((long)pvVar1 + 8),&local_28);
  }
  else {
    to_string((mjs *)&gStack_48,*(gc_heap **)((long)pvVar1 + 8),v);
  }
  new_string((mjs *)&local_38,&(this->f).global,(string *)&gStack_48);
  __return_storage_ptr__->type_ = object;
  (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
  heap_ = local_38.heap_;
  *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_38.pos_;
  if (local_38.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_38.heap_,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_38);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&gStack_48);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }